

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LayerShapeConstraints.cpp
# Opt level: O3

ShapeRange * __thiscall
CoreML::ShapeRange::unify(ShapeRange *__return_storage_ptr__,ShapeRange *this,ShapeRange *other)

{
  ulong uVar1;
  size_t sVar2;
  ShapeRange *val;
  RangeValue *val_00;
  RangeValue local_30;
  
  ShapeRange(__return_storage_ptr__);
  local_30._isUnbound = (other->_minimum)._isUnbound;
  local_30._val = (other->_minimum)._val;
  val = this;
  if ((local_30._isUnbound & 1U) == 0) {
    if ((this->_minimum)._isUnbound != true) {
      uVar1 = (this->_minimum)._val;
      sVar2 = RangeValue::value(&local_30);
      if (uVar1 <= sVar2) goto LAB_002781c3;
      local_30._isUnbound = (other->_minimum)._isUnbound;
      local_30._val = (other->_minimum)._val;
    }
    val = (ShapeRange *)&local_30;
  }
LAB_002781c3:
  setLower(__return_storage_ptr__,&val->_minimum);
  local_30._isUnbound = (other->_maximum)._isUnbound;
  local_30._val = (other->_maximum)._val;
  if ((this->_maximum)._isUnbound == true) {
LAB_002781e0:
    val_00 = &this->_maximum;
  }
  else {
    if ((local_30._isUnbound & 1U) == 0) {
      uVar1 = (this->_maximum)._val;
      sVar2 = RangeValue::value(&local_30);
      if (sVar2 <= uVar1) goto LAB_002781e0;
      local_30._isUnbound = (other->_maximum)._isUnbound;
      local_30._val = (other->_maximum)._val;
    }
    val_00 = &local_30;
  }
  setUpper(__return_storage_ptr__,val_00);
  return __return_storage_ptr__;
}

Assistant:

ShapeRange ShapeRange::unify(const ShapeRange& other) const {
    ShapeRange out;

    if (_minimum <= other.minimum())
        out.setLower(_minimum);
    else
        out.setLower(other.minimum());

    if (_maximum >= other.maximum())
        out.setUpper(_maximum);
    else
        out.setUpper(other.maximum());

    return out;
}